

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directories.cpp
# Opt level: O0

void directories::MADPCreateResultsDir(string *method,MultiAgentDecisionProcessInterface *problem)

{
  long *in_RSI;
  string *in_stack_00000288;
  string *in_stack_00000290;
  string local_30 [48];
  
  (**(code **)(*in_RSI + 0x20))();
  MADPCreateResultsDir(in_stack_00000290,in_stack_00000288);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void
directories::MADPCreateResultsDir(const string & method,
                                  const MultiAgentDecisionProcessInterface
                                  *problem)
{
    return(MADPCreateResultsDir(method,problem->GetUnixName()));
}